

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkref.c
# Opt level: O2

void * nn_chunkref_getchunk(nn_chunkref *self)

{
  FILE *__stream;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  void **result;
  void *chunk;
  
  if ((ulong)(self->u).ref[0] == 0xff) {
    (self->u).ref[0] = '\0';
    result = (void **)((long)&self->u + 8);
  }
  else {
    result = &chunk;
    iVar1 = nn_chunk_alloc((ulong)(self->u).ref[0],0,result);
    if (iVar1 != 0) {
      nn_backtrace_print();
      __stream = _stderr;
      puVar2 = (uint *)__errno_location();
      pcVar3 = nn_err_strerror(*puVar2);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar2,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/chunkref.c"
              ,0x5a);
      fflush(_stderr);
      nn_err_abort();
    }
    memcpy(chunk,(void *)((long)&self->u + 1),(ulong)(self->u).ref[0]);
    (self->u).ref[0] = '\0';
  }
  return *result;
}

Assistant:

void *nn_chunkref_getchunk (struct nn_chunkref *self)
{
    int rc;
    struct nn_chunkref_chunk *ch;
    void *chunk;

    if (self->u.ref [0] == 0xff) {
        ch = (struct nn_chunkref_chunk*) self;
        self->u.ref [0] = 0;
        return ch->chunk;
    }

    rc = nn_chunk_alloc (self->u.ref [0], 0, &chunk);
    errno_assert (rc == 0);
    memcpy (chunk, &self->u.ref [1], self->u.ref [0]);
    self->u.ref [0] = 0;
    return chunk;
}